

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O0

int lj_cf_jit_attach(lua_State *L)

{
  int iVar1;
  GCfunc *pGVar2;
  GCstr *pGVar3;
  TValue *pTVar4;
  uint local_2c;
  GCstr *pGStack_28;
  uint32_t h;
  uint8_t *p;
  GCstr *s;
  GCfunc *fn;
  lua_State *L_local;
  
  pGVar2 = lj_lib_checkfunc(L,1);
  pGVar3 = lj_lib_optstr(L,2);
  luaL_findtable(L,-10000,"_VMEVENTS",4);
  if (pGVar3 == (GCstr *)0x0) {
    pTVar4 = L->top;
    L->top = pTVar4 + 1;
    pTVar4->u64 = 0xffffffffffffffff;
    while (iVar1 = lua_next(L,-2), iVar1 != 0) {
      L->top = L->top + -1;
      if (((int)(L->top->field_4).it >> 0xf == -9) &&
         ((GCfunc *)(L->top->u64 & 0x7fffffffffff) == pGVar2)) {
        pTVar4 = lj_tab_set(L,(GCtab *)(L->top[-2].u64 & 0x7fffffffffff),L->top + -1);
        pTVar4->u64 = 0xffffffffffffffff;
      }
    }
  }
  else {
    local_2c = pGVar3->len;
    pGStack_28 = pGVar3 + 1;
    while ((char)(pGStack_28->nextgc).gcptr64 != '\0') {
      local_2c = local_2c ^
                 (local_2c << 6 | local_2c >> 0x1a) + (uint)(byte)(pGStack_28->nextgc).gcptr64;
      pGStack_28 = (GCstr *)((long)&(pGStack_28->nextgc).gcptr64 + 1);
    }
    lua_pushvalue(L,1);
    lua_rawseti(L,-2,local_2c << 3);
    *(undefined1 *)((L->glref).ptr64 + 0x93) = 0xff;
  }
  return 0;
}

Assistant:

LJLIB_CF(jit_attach)
{
#ifdef LUAJIT_DISABLE_VMEVENT
  luaL_error(L, "vmevent API disabled");
#else
  GCfunc *fn = lj_lib_checkfunc(L, 1);
  GCstr *s = lj_lib_optstr(L, 2);
  luaL_findtable(L, LUA_REGISTRYINDEX, LJ_VMEVENTS_REGKEY, LJ_VMEVENTS_HSIZE);
  if (s) {  /* Attach to given event. */
    const uint8_t *p = (const uint8_t *)strdata(s);
    uint32_t h = s->len;
    while (*p) h = h ^ (lj_rol(h, 6) + *p++);
    lua_pushvalue(L, 1);
    lua_rawseti(L, -2, VMEVENT_HASHIDX(h));
    G(L)->vmevmask = VMEVENT_NOCACHE;  /* Invalidate cache. */
  } else {  /* Detach if no event given. */
    setnilV(L->top++);
    while (lua_next(L, -2)) {
      L->top--;
      if (tvisfunc(L->top) && funcV(L->top) == fn) {
	setnilV(lj_tab_set(L, tabV(L->top-2), L->top-1));
      }
    }
  }
#endif
  return 0;
}